

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O1

vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
* acquire_locks(vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                *__return_storage_ptr__,IteratorPopCommand *cmd,DatabaseSnapshot *snap)

{
  pointer pcVar1;
  initializer_list<std::variant<DatasetLock,_IteratorLock>_> __l;
  allocator_type local_61;
  uchar *local_60;
  undefined8 local_58;
  uchar local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  _Variadic_union<DatasetLock,_IteratorLock> local_40;
  undefined1 local_20;
  
  pcVar1 = (cmd->iterator_id)._M_dataplus._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,pcVar1,pcVar1 + (cmd->iterator_id)._M_string_length);
  local_40._0_8_ = local_40._M_first._M_storage._M_storage + 0x10;
  if (local_60 == &local_50) {
    local_40._24_8_ = uStack_48;
  }
  else {
    local_40._0_8_ = local_60;
  }
  local_40._8_8_ = local_58;
  local_58 = 0;
  local_50 = '\0';
  local_20 = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_40;
  local_60 = &local_50;
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector(__return_storage_ptr__,__l,&local_61);
  std::__detail::__variant::_Variant_storage<false,_DatasetLock,_IteratorLock>::~_Variant_storage
            ((_Variant_storage<false,_DatasetLock,_IteratorLock> *)&local_40._M_first);
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DatabaseLock> acquire_locks(
    const IteratorPopCommand &cmd,
    [[maybe_unused]] const DatabaseSnapshot *snap) {
    return {IteratorLock(cmd.get_iterator_id())};
}